

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

string * __thiscall pbrt::DiffuseAreaLight::ToString_abi_cxx11_(DiffuseAreaLight *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char **in_RSI;
  string *in_RDI;
  Image *unaff_retaddr;
  LightBase *in_stack_ffffffffffffff78;
  ShapeHandle *args_3;
  float *in_stack_ffffffffffffffb8;
  DenselySampledSpectrum *in_stack_ffffffffffffffc0;
  TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
  in_stack_ffffffffffffffd0;
  char **args_4;
  string *args_5;
  
  args_3 = (ShapeHandle *)&stack0xffffffffffffffd0;
  args_4 = in_RSI;
  args_5 = in_RDI;
  LightBase::BaseToString_abi_cxx11_(in_stack_ffffffffffffff78);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x9602a4;
  if (((ulong)in_RSI[0x1a] & 1) != 0) {
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3213871;
  }
  StringPrintf<std::__cxx11::string,pbrt::DenselySampledSpectrum_const&,float_const&,pbrt::ShapeHandle_const&,char_const*,float_const&,pbrt::Image_const&>
            ((char *)in_stack_ffffffffffffffd0.bits,args,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,args_3,args_4,(float *)args_5,unaff_retaddr);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return in_RDI;
}

Assistant:

std::string DiffuseAreaLight::ToString() const {
    return StringPrintf("[ DiffuseAreaLight %s Lemit: %s scale: %f shape: %s "
                        "twoSided: %s area: %f image: %s ]",
                        BaseToString(), Lemit, scale, shape, twoSided ? "true" : "false",
                        area, image);
}